

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

void checktab(lua_State *L,int arg,int what)

{
  int iVar1;
  int local_1c;
  int n;
  int what_local;
  int arg_local;
  lua_State *L_local;
  
  iVar1 = lua_type(L,arg);
  if (iVar1 == 5) {
    return;
  }
  local_1c = 1;
  iVar1 = lua_getmetatable(L,arg);
  if (iVar1 == 0) {
LAB_00136841:
    luaL_checktype(L,arg,5);
  }
  else {
    if ((what & 1U) != 0) {
      local_1c = 2;
      iVar1 = checkfield(L,"__index",2);
      if (iVar1 == 0) goto LAB_00136841;
    }
    if ((what & 2U) != 0) {
      local_1c = local_1c + 1;
      iVar1 = checkfield(L,"__newindex",local_1c);
      if (iVar1 == 0) goto LAB_00136841;
    }
    if ((what & 4U) != 0) {
      local_1c = local_1c + 1;
      iVar1 = checkfield(L,"__len",local_1c);
      if (iVar1 == 0) goto LAB_00136841;
    }
    lua_settop(L,-1 - local_1c);
  }
  return;
}

Assistant:

static void checktab (lua_State *L, int arg, int what) {
  if (lua_type(L, arg) != LUA_TTABLE) {  /* is it not a table? */
    int n = 1;  /* number of elements to pop */
    if (lua_getmetatable(L, arg) &&  /* must have metatable */
        (!(what & TAB_R) || checkfield(L, "__index", ++n)) &&
        (!(what & TAB_W) || checkfield(L, "__newindex", ++n)) &&
        (!(what & TAB_L) || checkfield(L, "__len", ++n))) {
      lua_pop(L, n);  /* pop metatable and tested metamethods */
    }
    else
      luaL_checktype(L, arg, LUA_TTABLE);  /* force an error */
  }
}